

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall RandStrCatList::RandStrCatList(RandStrCatList *this,RandStrParser *p)

{
  RandStrNode *pRVar1;
  wchar_t wVar2;
  RandStrRepeat *this_00;
  RandStrNode **ppRVar3;
  
  (this->super_RandStrNode).firstChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).lastChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).nextSibling = (RandStrNode *)0x0;
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_003601d8;
  if (p->rem != 0) {
    do {
      wVar2 = utf8_ptr::s_getch((p->p).p_);
      if (wVar2 == L')') {
        return;
      }
      if ((p->rem != 0) && (wVar2 = utf8_ptr::s_getch((p->p).p_), wVar2 == L'|')) {
        return;
      }
      this_00 = (RandStrRepeat *)operator_new(0x28);
      RandStrRepeat::RandStrRepeat(this_00,p);
      pRVar1 = (this->super_RandStrNode).lastChild;
      ppRVar3 = &pRVar1->nextSibling;
      if (pRVar1 == (RandStrNode *)0x0) {
        ppRVar3 = &(this->super_RandStrNode).firstChild;
      }
      *ppRVar3 = (RandStrNode *)this_00;
      (this->super_RandStrNode).lastChild = (RandStrNode *)this_00;
    } while (p->rem != 0);
  }
  return;
}

Assistant:

RandStrNode()
    {
        firstChild = lastChild = 0;
        nextSibling = 0;
    }